

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_IterMultiWithDelete::_Run(_Test_IterMultiWithDelete *this)

{
  DB *pDVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined1 local_d68 [448];
  undefined1 local_ba8 [448];
  Slice local_9e8;
  ReadOptions local_9d8;
  long *local_9c8;
  Iterator *iter;
  Snapshot local_9b8 [4];
  undefined1 local_998 [455];
  allocator local_7d1;
  string local_7d0 [32];
  undefined1 local_7b0 [431];
  allocator local_601;
  string local_600 [39];
  allocator local_5d9;
  string local_5d8 [32];
  undefined1 local_5b8 [431];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [32];
  undefined1 local_3c0 [431];
  allocator local_211;
  string local_210 [55];
  allocator local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [424];
  _Test_IterMultiWithDelete *local_10;
  _Test_IterMultiWithDelete *this_local;
  long *plVar4;
  
  local_10 = this;
  do {
    test::Tester::Tester
              ((Tester *)(local_1b8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3b5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"a",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_210,"va",&local_211);
    DBTest::Put((DBTest *)local_1b8,(string *)this,(string *)local_1d8);
    test::Tester::IsOk((Tester *)(local_1b8 + 8),(Status *)local_1b8);
    Status::~Status((Status *)local_1b8);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    test::Tester::~Tester((Tester *)(local_1b8 + 8));
    test::Tester::Tester
              ((Tester *)(local_3c0 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3b6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e0,"b",&local_3e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_408,"vb",&local_409);
    DBTest::Put((DBTest *)local_3c0,(string *)this,(string *)local_3e0);
    test::Tester::IsOk((Tester *)(local_3c0 + 8),(Status *)local_3c0);
    Status::~Status((Status *)local_3c0);
    std::__cxx11::string::~string(local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    std::__cxx11::string::~string(local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    test::Tester::~Tester((Tester *)(local_3c0 + 8));
    test::Tester::Tester
              ((Tester *)(local_5b8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3b7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5d8,"c",&local_5d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_600,"vc",&local_601);
    DBTest::Put((DBTest *)local_5b8,(string *)this,(string *)local_5d8);
    test::Tester::IsOk((Tester *)(local_5b8 + 8),(Status *)local_5b8);
    Status::~Status((Status *)local_5b8);
    std::__cxx11::string::~string(local_600);
    std::allocator<char>::~allocator((allocator<char> *)&local_601);
    std::__cxx11::string::~string(local_5d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
    test::Tester::~Tester((Tester *)(local_5b8 + 8));
    test::Tester::Tester
              ((Tester *)(local_7b0 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7d0,"b",&local_7d1);
    DBTest::Delete((DBTest *)local_7b0,(string *)this);
    test::Tester::IsOk((Tester *)(local_7b0 + 8),(Status *)local_7b0);
    Status::~Status((Status *)local_7b0);
    std::__cxx11::string::~string(local_7d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
    test::Tester::~Tester((Tester *)(local_7b0 + 8));
    test::Tester::Tester
              ((Tester *)(local_998 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_9b8,"b",(allocator *)((long)&iter + 7));
    DBTest::Get((DBTest *)local_998,(string *)this,local_9b8);
    test::Tester::IsEq<char[10],std::__cxx11::string>
              ((Tester *)(local_998 + 0x20),(char (*) [10])"NOT_FOUND",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_998);
    std::__cxx11::string::~string((string *)local_998);
    std::__cxx11::string::~string((string *)local_9b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&iter + 7));
    test::Tester::~Tester((Tester *)(local_998 + 0x20));
    pDVar1 = (this->super_DBTest).db_;
    local_9d8.verify_checksums = false;
    local_9d8.fill_cache = false;
    local_9d8._2_6_ = 0;
    local_9d8.snapshot = (Snapshot *)0x0;
    ReadOptions::ReadOptions(&local_9d8);
    iVar3 = (*pDVar1->_vptr_DB[6])(pDVar1,&local_9d8);
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    local_9c8 = plVar4;
    Slice::Slice(&local_9e8,"c");
    (**(code **)(*plVar4 + 0x28))(plVar4,&local_9e8);
    test::Tester::Tester
              ((Tester *)(local_ba8 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3bd);
    DBTest::IterStatus_abi_cxx11_((DBTest *)local_ba8,(Iterator *)this);
    test::Tester::IsEq<std::__cxx11::string,char[6]>
              ((Tester *)(local_ba8 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ba8,
               (char (*) [6])"c->vc");
    std::__cxx11::string::~string((string *)local_ba8);
    test::Tester::~Tester((Tester *)(local_ba8 + 0x20));
    (**(code **)(*local_9c8 + 0x38))();
    test::Tester::Tester
              ((Tester *)(local_d68 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3bf);
    DBTest::IterStatus_abi_cxx11_((DBTest *)local_d68,(Iterator *)this);
    test::Tester::IsEq<std::__cxx11::string,char[6]>
              ((Tester *)(local_d68 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d68,
               (char (*) [6])"a->va");
    std::__cxx11::string::~string((string *)local_d68);
    test::Tester::~Tester((Tester *)(local_d68 + 0x20));
    if (local_9c8 != (long *)0x0) {
      (**(code **)(*local_9c8 + 8))();
    }
    bVar2 = DBTest::ChangeOptions(&this->super_DBTest);
  } while (bVar2);
  return;
}

Assistant:

TEST(DBTest, IterMultiWithDelete) {
  do {
    ASSERT_OK(Put("a", "va"));
    ASSERT_OK(Put("b", "vb"));
    ASSERT_OK(Put("c", "vc"));
    ASSERT_OK(Delete("b"));
    ASSERT_EQ("NOT_FOUND", Get("b"));

    Iterator* iter = db_->NewIterator(ReadOptions());
    iter->Seek("c");
    ASSERT_EQ(IterStatus(iter), "c->vc");
    iter->Prev();
    ASSERT_EQ(IterStatus(iter), "a->va");
    delete iter;
  } while (ChangeOptions());
}